

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
fasttext::FastText::selectEmbeddings
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,FastText *this,int32_t cutoff)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  pointer piVar5;
  int32_t iVar6;
  DenseMatrix *this_00;
  int64_t m;
  size_type __n;
  pointer piVar7;
  ulong uVar8;
  int *piVar9;
  bool bVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_00;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  string_view w;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_facebookresearch[P]fastText_src_fasttext_cc:313:37)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_facebookresearch[P]fastText_src_fasttext_cc:313:37)>
  __comp_00;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_facebookresearch[P]fastText_src_fasttext_cc:313:37)>
  __comp_01;
  Vector norms;
  allocator_type local_51;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  Vector local_48;
  value_type_conflict1 local_34;
  
  peVar3 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    this_00 = (DenseMatrix *)0x0;
  }
  else {
    this_00 = (DenseMatrix *)__dynamic_cast(peVar3,&Matrix::typeinfo,&DenseMatrix::typeinfo,0);
  }
  if (this_00 == (DenseMatrix *)0x0) {
    local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (DenseMatrix *)0x0;
  }
  else {
    local_50 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
  }
  m = Matrix::size(&this_00->super_Matrix,0);
  Vector::Vector(&local_48,m);
  DenseMatrix::l2NormRow(this_00,&local_48);
  __n = Matrix::size(&this_00->super_Matrix,0);
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_34,&local_51);
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar7 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 != piVar7) {
    auVar11 = vpbroadcastq_avx512f();
    auVar11 = vpsrlq_avx512f(auVar11,2);
    auVar12 = vpmovsxbd_avx512f(_DAT_00142020);
    uVar8 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar15 = vpbroadcastd_avx512f(ZEXT416(0x10));
    do {
      auVar16 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar16,auVar13);
      auVar16 = vporq_avx512f(auVar16,auVar14);
      vpcmpuq_avx512f(auVar16,auVar11,2);
      vpcmpuq_avx512f(auVar17,auVar11,2);
      auVar16 = vmovdqu32_avx512f(auVar12);
      *(undefined1 (*) [64])(piVar4 + uVar8) = auVar16;
      uVar8 = uVar8 + 0x10;
      auVar12 = vpaddd_avx512f(auVar12,auVar15);
    } while ((((ulong)((long)piVar7 + (-4 - (long)piVar4)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar8);
  }
  w._M_str = Dictionary::EOS_abi_cxx11_;
  w._M_len = DAT_001523e0;
  iVar6 = Dictionary::getId((this->dict_).
                            super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,w);
  __first._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    __comp._M_comp.eosid = iVar6;
    __comp._M_comp.norms = &local_48;
    __comp._M_comp._12_4_ = 0;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
              (__first,__last,
               (ulong)(uint)((int)LZCOUNT((long)__last._M_current - (long)__first._M_current >> 2) *
                            2) ^ 0x7e,__comp);
    if ((long)__last._M_current - (long)__first._M_current < 0x41) {
      __comp_01._M_comp.eosid = iVar6;
      __comp_01._M_comp.norms = &local_48;
      __comp_01._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last,__comp_01);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      __comp_00._M_comp.eosid = iVar6;
      __comp_00._M_comp.norms = &local_48;
      __comp_00._M_comp._12_4_ = 0;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<fasttext::FastText::selectEmbeddings(int)const::__0>>
                (__first,__last_00,__comp_00);
      for (; __last_00._M_current != __last._M_current;
          __last_00._M_current = __last_00._M_current + 1) {
        iVar1 = *__last_00._M_current;
        piVar9 = __last_00._M_current;
        while( true ) {
          iVar2 = piVar9[-1];
          if (iVar2 != iVar6 && iVar1 != iVar6) {
            bVar10 = local_48.data_.mem_[iVar2] < local_48.data_.mem_[iVar1];
          }
          else {
            bVar10 = iVar1 == iVar6 && iVar2 != iVar6;
          }
          if (!bVar10) break;
          *piVar9 = iVar2;
          piVar9 = piVar9 + -1;
        }
        *piVar9 = iVar1;
      }
    }
  }
  piVar7 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start + cutoff;
  piVar4 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((piVar7 != piVar4) &&
     (piVar5 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,
     piVar7 = (pointer)((long)piVar7 + ((long)piVar5 - (long)piVar4)), piVar5 != piVar7)) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = piVar7;
  }
  free(local_48.data_.mem_);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> FastText::selectEmbeddings(int32_t cutoff) const {
  std::shared_ptr<DenseMatrix> input =
      std::dynamic_pointer_cast<DenseMatrix>(input_);
  Vector norms(input->size(0));
  input->l2NormRow(norms);
  std::vector<int32_t> idx(input->size(0), 0);
  std::iota(idx.begin(), idx.end(), 0);
  auto eosid = dict_->getId(Dictionary::EOS);
  std::sort(idx.begin(), idx.end(), [&norms, eosid](size_t i1, size_t i2) {
    if (i1 == eosid && i2 == eosid) { // satisfy strict weak ordering
      return false;
    }
    return eosid == i1 || (eosid != i2 && norms[i1] > norms[i2]);
  });
  idx.erase(idx.begin() + cutoff, idx.end());
  return idx;
}